

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

void __thiscall
sptk::reaper::EpochTracker::Window
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,int32_t offset,
          size_t size,float *output)

{
  vector<float,_std::allocator<float>_> *this_00;
  pointer pfVar1;
  pointer pfVar2;
  size_t sVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  this_00 = &this->window_;
  if ((long)(this->window_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->window_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 == size) {
    if (size == 0) {
      return;
    }
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize(this_00,size);
    if (size == 0) {
      return;
    }
    auVar5._8_4_ = (int)(size >> 0x20);
    auVar5._0_8_ = size;
    auVar5._12_4_ = 0x45300000;
    sVar3 = 0;
    do {
      auVar6._8_4_ = (int)(sVar3 >> 0x20);
      auVar6._0_8_ = sVar3;
      auVar6._12_4_ = 0x45300000;
      dVar4 = cos(((auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0) + 0.5) *
                  (double)(float)(6.283185307179586 /
                                 ((auVar5._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0))));
      (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[sVar3] = (float)(dVar4 * -0.5 + 0.5);
      sVar3 = sVar3 + 1;
    } while (size != sVar3);
  }
  pfVar1 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = 0;
  do {
    output[sVar3] = pfVar1[(long)offset + sVar3] * pfVar2[sVar3];
    sVar3 = sVar3 + 1;
  } while (size != sVar3);
  return;
}

Assistant:

void EpochTracker::Window(const std::vector<float>& input, int32_t offset, size_t size,
                          float* output) {
  if (size != window_.size()) {
    window_.resize(size);
    float arg = 2.0 * M_PI / size;
    for (size_t i = 0; i < size; ++i) {
      window_[i] = 0.5 - (0.5 * cos((i + 0.5) * arg));
    }
  }
  const float* data = (&(input.front())) + offset;
  for (size_t i = 0; i < size; ++i) {
    output[i] = data[i] * window_[i];
  }
}